

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::ConChat(IResult *pResult,void *pUserData)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  IConsole *pIVar3;
  long in_RSI;
  IResult *in_RDI;
  int ClientID;
  int i;
  int Target;
  char *pMode;
  CChat *pChat;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int in_stack_ffffffffffffffdc;
  CChat *this;
  
  iVar1 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
  this = (CChat *)CONCAT44(extraout_var,iVar1);
  iVar1 = str_comp((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    EnableMode(this,in_stack_ffffffffffffffdc,
               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    iVar1 = str_comp((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      EnableMode(this,in_stack_ffffffffffffffdc,
                 (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      iVar1 = str_comp((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
      if (iVar1 == 0) {
        iVar1 = *(int *)(in_RSI + 0x25c48);
        iVar2 = IConsole::IResult::NumArguments(in_RDI);
        if (iVar2 == 2) {
          iVar2 = (*in_RDI->_vptr_IResult[2])(in_RDI,1);
        }
        else {
          for (local_28 = 0;
              (iVar2 = iVar1, local_28 < 0x40 &&
              ((in_stack_ffffffffffffffd4 = (iVar1 + local_28) % 0x40,
               (*(byte *)(*(long *)(in_RSI + 8) + (long)in_stack_ffffffffffffffd4 * 0x5b0 + 0x4aec)
               & 1) == 0 ||
               (iVar2 = in_stack_ffffffffffffffd4,
               *(int *)(*(long *)(in_RSI + 8) + 0x1b140) == in_stack_ffffffffffffffd4))));
              local_28 = local_28 + 1) {
          }
        }
        if ((((iVar2 < 0) || (0x3f < iVar2)) ||
            ((*(byte *)(*(long *)(in_RSI + 8) + (long)iVar2 * 0x5b0 + 0x4aec) & 1) == 0)) ||
           (*(int *)(*(long *)(in_RSI + 8) + 0x1b140) == iVar2)) {
          iVar1 = IConsole::IResult::NumArguments(in_RDI);
          if (iVar1 == 2) {
            pIVar3 = CComponent::Console((CComponent *)0x14d685);
            (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                      (pIVar3,0,"console","please enter a valid ClientID");
          }
        }
        else {
          *(int *)(in_RSI + 0x25c48) = iVar2;
          EnableMode(this,iVar2,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
      }
      else {
        pIVar3 = CComponent::Console((CComponent *)0x14d6d5);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar3,0,"console","expected all, team or whisper as mode");
      }
    }
  }
  return;
}

Assistant:

void CChat::ConChat(IConsole::IResult *pResult, void *pUserData)
{
	CChat *pChat = (CChat *)pUserData;

	const char *pMode = pResult->GetString(0);
	if(str_comp(pMode, "all") == 0)
		pChat->EnableMode(CHAT_ALL);
	else if(str_comp(pMode, "team") == 0)
		pChat->EnableMode(CHAT_TEAM);
	else if(str_comp(pMode, "whisper") == 0)
	{
		int Target = pChat->m_WhisperTarget; // default to ID of last target
		if(pResult->NumArguments() == 2)
			Target = pResult->GetInteger(1);
		else
		{
			// pick next valid player as target
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				int ClientID = (Target + i) % MAX_CLIENTS;
				if(pChat->m_pClient->m_aClients[ClientID].m_Active && pChat->m_pClient->m_LocalClientID != ClientID)
				{
					Target = ClientID;
					break;
				}
			}
		}
		if(Target < 0 || Target >= MAX_CLIENTS || !pChat->m_pClient->m_aClients[Target].m_Active || pChat->m_pClient->m_LocalClientID == Target)
		{
			if(pResult->NumArguments() == 2)
				pChat->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "please enter a valid ClientID");
		}
		else
		{
			pChat->m_WhisperTarget = Target;
			pChat->EnableMode(CHAT_WHISPER);
		}
	}
	else
		((CChat*)pUserData)->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "expected all, team or whisper as mode");
}